

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleRPathRemoveCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  ulong uVar6;
  cmSystemToolsFileTime *t;
  allocator<char> local_5b1;
  undefined1 local_5b0 [8];
  string message;
  undefined1 local_570 [8];
  ostringstream e_2;
  bool local_3f1;
  undefined1 local_3f0 [7];
  bool removed;
  string emsg;
  bool have_ft;
  cmSystemToolsFileTime *ft;
  undefined1 local_3b8 [7];
  bool success;
  undefined1 local_398 [8];
  ostringstream e_1;
  allocator<char> local_219;
  string local_218;
  undefined4 local_1f4;
  string local_1f0;
  undefined1 local_1d0 [8];
  ostringstream e;
  uint local_48;
  uint i;
  Doing doing;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  file.field_2._8_8_ = args;
  std::__cxx11::string::string((string *)&i);
  bVar2 = false;
  local_48 = 1;
  do {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)file.field_2._8_8_);
    if (sVar3 <= local_48) {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        bVar2 = cmsys::SystemTools::FileExists((string *)&i,true);
        if (bVar2) {
          t = cmSystemTools::FileTimeNew();
          emsg.field_2._M_local_buf[0xf] = cmSystemTools::FileTimeGet((string *)&i,t);
          std::__cxx11::string::string((string *)local_3f0);
          bVar2 = cmSystemTools::RemoveRPath((string *)&i,(string *)local_3f0,&local_3f1);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
            poVar5 = std::operator<<((ostream *)local_570,
                                     "RPATH_REMOVE could not remove RPATH from file:\n");
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = std::operator<<(poVar5,(string *)&i);
            poVar5 = std::operator<<(poVar5,"\n");
            std::operator<<(poVar5,(string *)local_3f0);
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)((long)&message.field_2 + 8));
            std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
          }
          ft._7_1_ = bVar2;
          if (ft._7_1_) {
            if ((local_3f1 & 1U) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_5b0,"Removed runtime path from \"",&local_5b1);
              std::allocator<char>::~allocator(&local_5b1);
              std::__cxx11::string::operator+=((string *)local_5b0,(string *)&i);
              std::__cxx11::string::operator+=((string *)local_5b0,"\"");
              cmMakefile::DisplayStatus((this->super_cmCommand).Makefile,(string *)local_5b0,-1.0);
              std::__cxx11::string::~string((string *)local_5b0);
            }
            if ((emsg.field_2._M_local_buf[0xf] & 1U) != 0) {
              cmSystemTools::FileTimeSet((string *)&i,t);
            }
          }
          cmSystemTools::FileTimeDelete(t);
          this_local._7_1_ = ft._7_1_;
          local_1f4 = 1;
          std::__cxx11::string::~string((string *)local_3f0);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
          poVar5 = std::operator<<((ostream *)local_398,"RPATH_REMOVE given FILE \"");
          poVar5 = std::operator<<(poVar5,(string *)&i);
          std::operator<<(poVar5,"\" that does not exist.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_3b8);
          std::__cxx11::string::~string((string *)local_3b8);
          this_local._7_1_ = false;
          local_1f4 = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_218,"RPATH_REMOVE not given FILE option.",&local_219);
        cmCommand::SetError(&this->super_cmCommand,&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::allocator<char>::~allocator(&local_219);
        this_local._7_1_ = false;
        local_1f4 = 1;
      }
LAB_003d375b:
      std::__cxx11::string::~string((string *)&i);
      return this_local._7_1_;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)file.field_2._8_8_,(ulong)local_48);
    bVar1 = std::operator==(pvVar4,"FILE");
    if (bVar1) {
      bVar2 = true;
    }
    else {
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        poVar5 = std::operator<<((ostream *)local_1d0,"RPATH_REMOVE given unknown argument ");
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)file.field_2._8_8_,(ulong)local_48);
        std::operator<<(poVar5,(string *)pvVar4);
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        this_local._7_1_ = false;
        local_1f4 = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        goto LAB_003d375b;
      }
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)file.field_2._8_8_,(ulong)local_48);
      std::__cxx11::string::operator=((string *)&i,(string *)pvVar4);
      bVar2 = false;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

bool cmFileCommand::HandleRPathRemoveCommand(
  std::vector<std::string> const& args)
{
  // Evaluate arguments.
  std::string file;
  enum Doing
  {
    DoingNone,
    DoingFile
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "FILE") {
      doing = DoingFile;
    } else if (doing == DoingFile) {
      file = args[i];
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "RPATH_REMOVE given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (file.empty()) {
    this->SetError("RPATH_REMOVE not given FILE option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    std::ostringstream e;
    e << "RPATH_REMOVE given FILE \"" << file << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }
  bool success = true;
  cmSystemToolsFileTime* ft = cmSystemTools::FileTimeNew();
  bool have_ft = cmSystemTools::FileTimeGet(file, ft);
  std::string emsg;
  bool removed;
  if (!cmSystemTools::RemoveRPath(file, &emsg, &removed)) {
    std::ostringstream e;
    /* clang-format off */
    e << "RPATH_REMOVE could not remove RPATH from file:\n"
      << "  " << file << "\n"
      << emsg;
    /* clang-format on */
    this->SetError(e.str());
    success = false;
  }
  if (success) {
    if (removed) {
      std::string message = "Removed runtime path from \"";
      message += file;
      message += "\"";
      this->Makefile->DisplayStatus(message, -1);
    }
    if (have_ft) {
      cmSystemTools::FileTimeSet(file, ft);
    }
  }
  cmSystemTools::FileTimeDelete(ft);
  return success;
}